

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall MidiPlayerDialog::on_addButton_clicked(MidiPlayerDialog *this)

{
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  Master *this_00;
  QSettings *pQVar8;
  iterator iVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QStringList fileNames;
  QString local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  this_00 = Master::getInstance();
  pQVar8 = Master::getSettings(this_00);
  if (on_addButton_clicked()::currentDir == '\0') {
    iVar7 = __cxa_guard_acquire(&on_addButton_clicked()::currentDir);
    if (iVar7 != 0) {
      QString::QString(&local_98,"Master/LastAddMidiFileDir");
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QSettings::value((QString *)local_78.data,(QVariant *)pQVar8);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_78);
      QVariant::~QVariant((QVariant *)&local_58);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QString::~QString,&on_addButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_addButton_clicked()::currentDir);
    }
  }
  QVar10.m_data = (storage_type *)0x19;
  QVar10.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar10);
  local_98.d.d = (Data *)local_58.shared;
  local_98.d.ptr = (char16_t *)local_58._8_8_;
  local_98.d.size = local_58._16_8_;
  QVariant::QVariant((QVariant *)&local_58,0);
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar8);
  uVar6 = QVariant::toInt((bool *)local_78.data);
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
    }
  }
  QVar11.m_data = (storage_type *)0x0;
  QVar11.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar11);
  local_98.d.d = (Data *)local_78.shared;
  local_98.d.ptr = (char16_t *)local_78._8_8_;
  local_98.d.size = local_78._16_8_;
  QVar12.m_data = (storage_type *)0x2b;
  QVar12.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar12);
  local_38 = local_78._0_4_;
  uStack_34 = local_78._4_4_;
  uStack_30 = local_78._8_4_;
  uStack_2c = local_78._12_4_;
  local_28 = local_78._16_8_;
  QFileDialog::getOpenFileNames
            (&local_58,this,&local_98,&on_addButton_clicked::currentDir,&local_38,0,uVar6);
  piVar1 = (int *)CONCAT44(uStack_34,local_38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),2,8);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_58._16_8_ != 0) {
    iVar9 = QList<QString>::begin((QList<QString> *)&local_58);
    QDir::QDir((QDir *)&local_98,(QString *)iVar9.i);
    QDir::absolutePath();
    uVar5 = local_78._16_8_;
    uVar4 = local_78.shared;
    pcVar3 = on_addButton_clicked::currentDir.d.ptr;
    pDVar2 = on_addButton_clicked::currentDir.d.d;
    local_78.shared = (PrivateShared *)on_addButton_clicked::currentDir.d.d;
    on_addButton_clicked::currentDir.d.d = (Data *)uVar4;
    on_addButton_clicked::currentDir.d.ptr = (char16_t *)local_78._8_8_;
    local_78._8_8_ = pcVar3;
    local_78._16_8_ = on_addButton_clicked::currentDir.d.size;
    on_addButton_clicked::currentDir.d.size = uVar5;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
    QDir::~QDir((QDir *)&local_98);
    QVar13.m_data = (storage_type *)0x19;
    QVar13.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar13);
    local_98.d.d = (Data *)local_78.shared;
    local_98.d.ptr = (char16_t *)local_78._8_8_;
    local_98.d.size = local_78._16_8_;
    QVariant::QVariant((QVariant *)&local_78,(QString *)&on_addButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar8,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)&local_78);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
      }
    }
    iVar7 = QListWidget::currentRow();
    QListWidget::insertItems((int)*(undefined8 *)(this->ui + 0x18),(QList *)(ulong)(iVar7 + 1));
    QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
    updateCurrentItem(this);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  return;
}

Assistant:

void MidiPlayerDialog::on_addButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QStringList fileNames = QFileDialog::getOpenFileNames(this, NULL, currentDir, "*.mid *.smf *.syx;;*.mid;;*.smf;;*.syx;;*.*",
		NULL, qFileDialogOptions);
	if (fileNames.isEmpty()) return;
	currentDir = QDir(fileNames.first()).absolutePath();
	settings->setValue("Master/LastAddMidiFileDir", currentDir);
	int row = ui->playList->currentRow();
	ui->playList->insertItems(row + 1, fileNames);
	ui->playList->setCurrentRow(row + fileNames.count());
	updateCurrentItem();
}